

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iconify.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  GLFWmonitor **ppGVar7;
  undefined8 *puVar8;
  GLFWwindow *pGVar9;
  GLFWmonitor *monitor;
  char *pcVar10;
  ulong __nmemb;
  char *pcVar11;
  ulong uVar12;
  long lVar13;
  int monitor_count;
  int local_3c;
  ulong local_38;
  
  bVar1 = false;
  iVar6 = 1;
  bVar4 = false;
  do {
    while( true ) {
      do {
        bVar2 = bVar4;
        iVar5 = getopt(argc,argv,"afhn");
        bVar4 = true;
      } while (iVar5 == 0x61);
      if (0x67 < iVar5) break;
      if (iVar5 != 0x66) {
        if (iVar5 == -1) {
          glfwSetErrorCallback(error_callback);
          iVar5 = glfwInit();
          if (iVar5 != 0) {
            glfwWindowHint(0x20006,iVar6);
            if (bVar2 && bVar1) {
              ppGVar7 = glfwGetMonitors(&local_3c);
              __nmemb = (ulong)local_3c;
              puVar8 = (undefined8 *)calloc(__nmemb,8);
              if (0 < (long)__nmemb) {
                lVar13 = 0;
                do {
                  pGVar9 = create_window(ppGVar7[lVar13]);
                  puVar8[lVar13] = pGVar9;
                  lVar13 = lVar13 + 1;
                } while (lVar13 < local_3c);
              }
            }
            else {
              if (bVar1) {
                monitor = glfwGetPrimaryMonitor();
              }
              else {
                monitor = (GLFWmonitor *)0x0;
              }
              puVar8 = (undefined8 *)calloc(1,8);
              pGVar9 = create_window(monitor);
              *puVar8 = pGVar9;
              __nmemb = 1;
            }
            local_38 = __nmemb;
            uVar3 = __nmemb;
            if (0 < (int)__nmemb) {
              uVar12 = 0;
              do {
                glfwSetKeyCallback((GLFWwindow *)puVar8[uVar12],key_callback);
                glfwSetFramebufferSizeCallback
                          ((GLFWwindow *)puVar8[uVar12],framebuffer_size_callback);
                glfwSetWindowSizeCallback((GLFWwindow *)puVar8[uVar12],window_size_callback);
                glfwSetWindowFocusCallback((GLFWwindow *)puVar8[uVar12],window_focus_callback);
                glfwSetWindowIconifyCallback((GLFWwindow *)puVar8[uVar12],window_iconify_callback);
                glfwSetWindowRefreshCallback((GLFWwindow *)puVar8[uVar12],window_refresh_callback);
                window_refresh_callback((GLFWwindow *)puVar8[uVar12]);
                iVar6 = glfwGetWindowAttrib((GLFWwindow *)puVar8[uVar12],0x20002);
                pcVar11 = "iconified";
                if (iVar6 == 0) {
                  pcVar11 = "restored";
                }
                iVar6 = glfwGetWindowAttrib((GLFWwindow *)puVar8[uVar12],0x20001);
                pcVar10 = "focused";
                if (iVar6 == 0) {
                  pcVar10 = "defocused";
                }
                printf("Window is %s and %s\n",pcVar11,pcVar10);
                uVar12 = uVar12 + 1;
                uVar3 = local_38;
              } while ((__nmemb & 0xffffffff) != uVar12);
            }
            do {
              glfwWaitEvents();
              if (0 < (int)uVar3) {
                uVar12 = 0;
                do {
                  iVar6 = glfwWindowShouldClose((GLFWwindow *)puVar8[uVar12]);
                  if (iVar6 != 0) {
                    glfwTerminate();
                    goto LAB_00110e15;
                  }
                  uVar12 = uVar12 + 1;
                } while ((__nmemb & 0xffffffff) != uVar12);
              }
              fflush(_stdout);
            } while( true );
          }
        }
        else {
LAB_00110cb0:
          usage();
        }
        exit(1);
      }
      bVar1 = true;
      bVar4 = bVar2;
    }
    if (iVar5 != 0x6e) {
      if (iVar5 == 0x68) {
        usage();
LAB_00110e15:
        exit(0);
      }
      goto LAB_00110cb0;
    }
    iVar6 = 0;
    bVar4 = bVar2;
  } while( true );
}

Assistant:

int main(int argc, char** argv)
{
    int ch, i, window_count;
    int auto_iconify = GLFW_TRUE, fullscreen = GLFW_FALSE, all_monitors = GLFW_FALSE;
    GLFWwindow** windows;

    while ((ch = getopt(argc, argv, "afhn")) != -1)
    {
        switch (ch)
        {
            case 'a':
                all_monitors = GLFW_TRUE;
                break;

            case 'h':
                usage();
                exit(EXIT_SUCCESS);

            case 'f':
                fullscreen = GLFW_TRUE;
                break;

            case 'n':
                auto_iconify = GLFW_FALSE;
                break;

            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_AUTO_ICONIFY, auto_iconify);

    if (fullscreen && all_monitors)
    {
        int monitor_count;
        GLFWmonitor** monitors = glfwGetMonitors(&monitor_count);

        window_count = monitor_count;
        windows = calloc(window_count, sizeof(GLFWwindow*));

        for (i = 0;  i < monitor_count;  i++)
        {
            windows[i] = create_window(monitors[i]);
            if (!windows[i])
                break;
        }
    }
    else
    {
        GLFWmonitor* monitor = NULL;

        if (fullscreen)
            monitor = glfwGetPrimaryMonitor();

        window_count = 1;
        windows = calloc(window_count, sizeof(GLFWwindow*));
        windows[0] = create_window(monitor);
    }

    for (i = 0;  i < window_count;  i++)
    {
        glfwSetKeyCallback(windows[i], key_callback);
        glfwSetFramebufferSizeCallback(windows[i], framebuffer_size_callback);
        glfwSetWindowSizeCallback(windows[i], window_size_callback);
        glfwSetWindowFocusCallback(windows[i], window_focus_callback);
        glfwSetWindowIconifyCallback(windows[i], window_iconify_callback);
        glfwSetWindowRefreshCallback(windows[i], window_refresh_callback);

        window_refresh_callback(windows[i]);

        printf("Window is %s and %s\n",
            glfwGetWindowAttrib(windows[i], GLFW_ICONIFIED) ? "iconified" : "restored",
            glfwGetWindowAttrib(windows[i], GLFW_FOCUSED) ? "focused" : "defocused");
    }

    for (;;)
    {
        glfwWaitEvents();

        for (i = 0;  i < window_count;  i++)
        {
            if (glfwWindowShouldClose(windows[i]))
                break;
        }

        if (i < window_count)
            break;

        // Workaround for an issue with msvcrt and mintty
        fflush(stdout);
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}